

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

Section __thiscall
QtPrivate::QCalendarYearValidator::handleKey(QCalendarYearValidator *this,int key)

{
  Section SVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar9 [16];
  
  switch(key) {
  case 0x1000012:
  case 0x1000014:
    this->m_pos = 0;
    break;
  case 0x1000013:
    this->m_pos = 0;
    this->m_year = this->m_year + 1;
    break;
  case 0x1000015:
    this->m_pos = 0;
    this->m_year = this->m_year + -1;
    break;
  default:
    if ((key != 0x1000003) && (key != 0x1000061)) {
      SVar1 = ThisSection;
      if (0xfffffff5 < key - 0x3aU) {
        iVar6 = this->m_pos;
        if (iVar6 < 1) {
          iVar7 = 1;
        }
        else {
          uVar2 = iVar6 - 1;
          auVar12 = _DAT_0067e440;
          iVar7 = 4;
          do {
            auVar8 = auVar12;
            auVar12._0_4_ = auVar8._0_4_ * 10;
            auVar10._8_4_ = (undefined4)((auVar8._8_8_ & 0xffffffff) * 10);
            auVar10._4_4_ = auVar10._8_4_;
            auVar10._0_4_ = auVar12._0_4_;
            iVar3 = auVar8._4_4_;
            auVar15._4_4_ = iVar3;
            auVar15._0_4_ = iVar3;
            auVar15._8_4_ = auVar8._12_4_;
            auVar15._12_4_ = auVar8._12_4_;
            auVar10._12_4_ = (int)((auVar15._8_8_ & 0xffffffff) * 10);
            auVar12._8_8_ = auVar10._8_8_;
            auVar12._4_4_ = iVar3 * 10;
            iVar3 = iVar7 + -4;
            iVar5 = iVar7 + (iVar6 + 3U & 0xfffffffc);
            iVar7 = iVar3;
          } while (iVar5 != 8);
          uVar4 = -iVar3;
          auVar13._0_4_ = -(uint)((int)(uVar2 ^ 0x80000000) < (int)(uVar4 ^ 0x80000000));
          auVar13._4_4_ = -(uint)((int)(uVar2 ^ 0x80000000) < (int)((uVar4 | 1) ^ 0x80000000));
          auVar13._8_4_ = -(uint)((int)(uVar2 ^ 0x80000000) < (int)((uVar4 | 2) ^ 0x80000000));
          auVar13._12_4_ = -(uint)((int)(uVar2 ^ 0x80000000) < (int)((uVar4 | 3) ^ 0x80000000));
          auVar12 = ~auVar13 & auVar12 | auVar8 & auVar13;
          iVar7 = auVar12._8_4_ * auVar12._0_4_ * auVar12._4_4_ * auVar12._12_4_;
        }
        iVar3 = this->m_year;
        this->m_year = (key - iVar3 % (iVar7 * 10)) + iVar3 + (iVar3 % iVar7) * 10 + -0x30;
        SVar1 = (Section)(iVar6 < 3);
        iVar7 = 0;
        if (iVar6 < 3) {
          iVar7 = iVar6 + 1;
        }
        this->m_pos = iVar7;
      }
      return SVar1;
    }
    iVar6 = 3;
    if (0 < this->m_pos) {
      iVar6 = this->m_pos + -1;
    }
    this->m_pos = iVar6;
    if (iVar6 < 1) {
      iVar7 = 1;
    }
    else {
      uVar2 = iVar6 - 1;
      auVar8 = _DAT_0067e440;
      iVar7 = 4;
      do {
        auVar12 = auVar8;
        auVar8._0_4_ = auVar12._0_4_ * 10;
        auVar9._8_4_ = (undefined4)((auVar12._8_8_ & 0xffffffff) * 10);
        auVar9._4_4_ = auVar9._8_4_;
        auVar9._0_4_ = auVar8._0_4_;
        iVar3 = auVar12._4_4_;
        auVar14._4_4_ = iVar3;
        auVar14._0_4_ = iVar3;
        auVar14._8_4_ = auVar12._12_4_;
        auVar14._12_4_ = auVar12._12_4_;
        auVar9._12_4_ = (int)((auVar14._8_8_ & 0xffffffff) * 10);
        auVar8._8_8_ = auVar9._8_8_;
        auVar8._4_4_ = iVar3 * 10;
        iVar3 = iVar7 + -4;
        iVar5 = iVar7 + (iVar6 + 3U & 0xfffffffc);
        iVar7 = iVar3;
      } while (iVar5 != 8);
      uVar4 = -iVar3;
      auVar11._0_4_ = -(uint)((int)(uVar2 ^ 0x80000000) < (int)(uVar4 ^ 0x80000000));
      auVar11._4_4_ = -(uint)((int)(uVar2 ^ 0x80000000) < (int)((uVar4 | 1) ^ 0x80000000));
      auVar11._8_4_ = -(uint)((int)(uVar2 ^ 0x80000000) < (int)((uVar4 | 2) ^ 0x80000000));
      auVar11._12_4_ = -(uint)((int)(uVar2 ^ 0x80000000) < (int)((uVar4 | 3) ^ 0x80000000));
      auVar12 = ~auVar11 & auVar8 | auVar12 & auVar11;
      iVar7 = auVar12._8_4_ * auVar12._0_4_ * auVar12._4_4_ * auVar12._12_4_;
    }
    this->m_year = (this->m_year % (iVar7 * 10)) / 10 + (this->m_oldYear - this->m_oldYear % iVar7);
    return (iVar6 == 0) + ThisSection;
  }
  return ThisSection;
}

Assistant:

QCalendarDateSectionValidator::Section QCalendarYearValidator::handleKey(int key)
{
    if (key == Qt::Key_Right || key == Qt::Key_Left) {
        m_pos = 0;
        return QCalendarDateSectionValidator::ThisSection;
    } else if (key == Qt::Key_Up) {
        m_pos = 0;
        ++m_year;
        return QCalendarDateSectionValidator::ThisSection;
    } else if (key == Qt::Key_Down) {
        m_pos = 0;
        --m_year;
        return QCalendarDateSectionValidator::ThisSection;
    } else if (key == Qt::Key_Back || key == Qt::Key_Backspace) {
        --m_pos;
        if (m_pos < 0)
            m_pos = 3;

        int pow = pow10(m_pos);
        m_year = m_oldYear / pow * pow + m_year % (pow * 10) / 10;

        if (m_pos == 0)
            return QCalendarDateSectionValidator::PrevSection;
        return QCalendarDateSectionValidator::ThisSection;
    }
    if (key < Qt::Key_0 || key > Qt::Key_9)
        return QCalendarDateSectionValidator::ThisSection;
    int pressedKey = key - Qt::Key_0;
    int pow = pow10(m_pos);
    m_year = m_year / (pow * 10) * (pow * 10) + m_year % pow * 10 + pressedKey;
    ++m_pos;
    if (m_pos > 3) {
        m_pos = 0;
        return QCalendarDateSectionValidator::NextSection;
    }
    return QCalendarDateSectionValidator::ThisSection;
}